

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
format::format_details::generic_format_value<std::__cxx11::string>::operator()
          (generic_format_value<std::__cxx11::string> *this,unsigned_long_long *value)

{
  undefined8 uVar1;
  bool bVar2;
  logic_error *this_00;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int local_68 [22];
  
  uVar1 = *(undefined8 *)this;
  if (*value == 0) {
    std::__cxx11::string::push_back((char)uVar1);
    return;
  }
  lVar4 = 1;
  uVar3 = *value;
  do {
    local_68[lVar4 + -1] = (int)uVar3 + (int)(uVar3 / 10) * -10;
    if (uVar3 < 10) {
      do {
        std::__cxx11::string::push_back((char)uVar1);
        lVar5 = lVar4 + -1;
        bVar2 = 0 < lVar4;
        lVar4 = lVar5;
      } while (lVar5 != 0 && bVar2);
      return;
    }
    lVar4 = lVar4 + 1;
    uVar3 = uVar3 / 10;
  } while (lVar4 != 0x15);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Too many decimals");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void operator()(T&& value) {
        format::append_value(output, std::forward<T>(value));
      }